

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

void __thiscall capnp::SchemaParser::setDiskFilesystem(SchemaParser *this,Filesystem *fs)

{
  bool bVar1;
  Impl *pIVar2;
  Maybe<capnp::SchemaParser::DiskFileCompat> *pMVar3;
  Fault local_78;
  Fault f;
  Maybe<capnp::SchemaParser::DiskFileCompat> *local_60;
  undefined1 local_58 [8];
  DebugComparison<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_&,_const_kj::None_&> _kjCondition;
  undefined1 local_28 [8];
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> lock;
  Filesystem *fs_local;
  SchemaParser *this_local;
  
  lock.ptr = (Maybe<capnp::SchemaParser::DiskFileCompat> *)fs;
  pIVar2 = kj::Own<capnp::SchemaParser::Impl,_std::nullptr_t>::operator->(&this->impl);
  kj::MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)local_28,
             &pIVar2->compat);
  pMVar3 = kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::operator*
                     ((Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)local_28);
  local_60 = (Maybe<capnp::SchemaParser::DiskFileCompat> *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pMVar3);
  kj::_::DebugExpression<kj::Maybe<capnp::SchemaParser::DiskFileCompat>&>::operator==
            ((DebugComparison<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_&,_const_kj::None_&> *)
             local_58,(DebugExpression<kj::Maybe<capnp::SchemaParser::DiskFileCompat>&> *)&local_60,
             (None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<capnp::SchemaParser::DiskFileCompat>&,kj::None_const&>&,char_const(&)[54]>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
               ,0x11c,FAILED,"*lock == kj::none",
               "_kjCondition,\"already called parseDiskFile() or setDiskFilesystem()\"",
               (DebugComparison<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_&,_const_kj::None_&>
                *)local_58,(char (*) [54])"already called parseDiskFile() or setDiskFilesystem()");
    kj::_::Debug::Fault::fatal(&local_78);
  }
  pMVar3 = kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::operator->
                     ((Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)local_28);
  kj::Maybe<capnp::SchemaParser::DiskFileCompat>::emplace<kj::Filesystem&>
            (pMVar3,(Filesystem *)lock.ptr);
  kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::~Locked
            ((Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)local_28);
  return;
}

Assistant:

void SchemaParser::setDiskFilesystem(kj::Filesystem& fs) {
  auto lock = impl->compat.lockExclusive();
  KJ_REQUIRE(*lock == kj::none, "already called parseDiskFile() or setDiskFilesystem()");
  lock->emplace(fs);
}